

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlAttrPtr xmlSetNsProp(xmlNodePtr node,xmlNsPtr ns,xmlChar *name,xmlChar *value)

{
  int iVar1;
  _xmlNode *attr;
  xmlChar *pxVar2;
  xmlNodePtr pxVar3;
  xmlAttrPtr pxVar4;
  _xmlNode *p_Var5;
  _xmlNode **pp_Var6;
  _xmlDoc *node_00;
  
  if (ns == (xmlNsPtr)0x0) {
    pxVar2 = (xmlChar *)0x0;
  }
  else {
    pxVar2 = ns->href;
    if (pxVar2 == (xmlChar *)0x0) {
      return (xmlAttrPtr)0x0;
    }
  }
  attr = (_xmlNode *)xmlGetPropNodeInternal(node,name,pxVar2,0);
  if (attr != (_xmlNode *)0x0) {
    if (*(xmlAttributeType *)&attr->content == XML_ATTRIBUTE_ID) {
      xmlRemoveID(node->doc,(xmlAttrPtr)attr);
      *(xmlAttributeType *)&attr->content = XML_ATTRIBUTE_ID;
    }
    pp_Var6 = &attr->children;
    if (attr->children != (xmlNodePtr)0x0) {
      xmlFreeNodeList(attr->children);
    }
    *pp_Var6 = (_xmlNode *)0x0;
    attr->last = (_xmlNode *)0x0;
    attr->ns = ns;
    if (value != (xmlChar *)0x0) {
      iVar1 = xmlCheckUTF8(value);
      node_00 = node->doc;
      if (iVar1 == 0) {
        __xmlSimpleError(2,0x517,(xmlNodePtr)node_00,"string is not in UTF-8\n",(char *)0x0);
        node_00 = (_xmlDoc *)0x0;
        if (node->doc != (_xmlDoc *)0x0) {
          pxVar2 = xmlStrdup((xmlChar *)"ISO-8859-1");
          node_00 = node->doc;
          node_00->encoding = pxVar2;
        }
      }
      pxVar3 = xmlNewText(value);
      if (pxVar3 == (xmlNodePtr)0x0) {
        *pp_Var6 = (_xmlNode *)0x0;
        p_Var5 = (_xmlNode *)0x0;
      }
      else {
        pxVar3->doc = node_00;
        *pp_Var6 = pxVar3;
        do {
          p_Var5 = pxVar3;
          p_Var5->parent = attr;
          pxVar3 = p_Var5->next;
        } while (p_Var5->next != (_xmlNode *)0x0);
      }
      attr->last = p_Var5;
    }
    if (*(int *)&attr->content == 2) {
      xmlAddID((xmlValidCtxtPtr)0x0,node->doc,value,(xmlAttrPtr)attr);
    }
    return (xmlAttrPtr)attr;
  }
  pxVar4 = xmlNewPropInternal(node,ns,name,value,0);
  return pxVar4;
}

Assistant:

xmlAttrPtr
xmlSetNsProp(xmlNodePtr node, xmlNsPtr ns, const xmlChar *name,
	     const xmlChar *value)
{
    xmlAttrPtr prop;

    if (ns && (ns->href == NULL))
	return(NULL);
    prop = xmlGetPropNodeInternal(node, name, (ns != NULL) ? ns->href : NULL, 0);
    if (prop != NULL) {
	/*
	* Modify the attribute's value.
	*/
	if (prop->atype == XML_ATTRIBUTE_ID) {
	    xmlRemoveID(node->doc, prop);
	    prop->atype = XML_ATTRIBUTE_ID;
	}
	if (prop->children != NULL)
	    xmlFreeNodeList(prop->children);
	prop->children = NULL;
	prop->last = NULL;
	prop->ns = ns;
	if (value != NULL) {
	    xmlNodePtr tmp;

	    if(!xmlCheckUTF8(value)) {
	        xmlTreeErr(XML_TREE_NOT_UTF8, (xmlNodePtr) node->doc,
	                   NULL);
                if (node->doc != NULL)
                    node->doc->encoding = xmlStrdup(BAD_CAST "ISO-8859-1");
	    }
	    prop->children = xmlNewDocText(node->doc, value);
	    prop->last = NULL;
	    tmp = prop->children;
	    while (tmp != NULL) {
		tmp->parent = (xmlNodePtr) prop;
		if (tmp->next == NULL)
		    prop->last = tmp;
		tmp = tmp->next;
	    }
	}
	if (prop->atype == XML_ATTRIBUTE_ID)
	    xmlAddID(NULL, node->doc, value, prop);
	return(prop);
    }
    /*
    * No equal attr found; create a new one.
    */
    return(xmlNewPropInternal(node, ns, name, value, 0));
}